

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamReaderPrivate::LoadReferenceData(BamReaderPrivate *this)

{
  size_t in_RDI;
  RefData aReference;
  int32_t refLength;
  RaiiBuffer refName;
  uint32_t refNameLength;
  uint i;
  uint32_t numberRefSeqs;
  char buffer [4];
  RaiiBuffer *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  RefData *in_stack_ffffffffffffff30;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_ffffffffffffff50;
  BgzfStream *in_stack_ffffffffffffff58;
  string local_80 [32];
  RaiiBuffer local_60 [2];
  int local_40;
  int local_38 [4];
  value_type *local_28;
  uint local_18;
  uint local_14;
  uint local_10 [4];
  
  BgzfStream::Read(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_RDI);
  local_10[0] = UnpackUnsignedInt((char *)0x279372);
  if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
    SwapEndian_32(local_10);
  }
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::reserve
            (in_stack_ffffffffffffff50,in_RDI);
  for (local_14 = 0; local_14 != local_10[0]; local_14 = local_14 + 1) {
    BgzfStream::Read(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_RDI);
    local_18 = UnpackUnsignedInt((char *)0x2793f3);
    if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
      SwapEndian_32(&local_18);
    }
    RaiiBuffer::RaiiBuffer
              ((RaiiBuffer *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    BgzfStream::Read(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_RDI);
    BgzfStream::Read(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_RDI);
    local_38[0] = UnpackSignedInt((char *)0x27947b);
    if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
      SwapEndian_32(local_38);
    }
    std::__cxx11::string::string(local_80);
    RefData::RefData(in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->RefName,
                     (int32_t *)in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_80);
    in_stack_ffffffffffffff30 = (RefData *)&stack0xffffffffffffff57;
    in_stack_ffffffffffffff28 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff58,(char *)in_stack_ffffffffffffff28,
               (allocator *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff20 = local_60;
    std::__cxx11::string::operator=
              ((string *)in_stack_ffffffffffffff20,(string *)&stack0xffffffffffffff58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
    local_40 = local_38[0];
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::push_back
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    RefData::~RefData((RefData *)0x27958b);
    RaiiBuffer::~RaiiBuffer(in_stack_ffffffffffffff20);
  }
  return true;
}

Assistant:

bool BamReaderPrivate::LoadReferenceData()
{

    // get number of reference sequences
    char buffer[sizeof(uint32_t)];
    m_stream.Read(buffer, sizeof(uint32_t));
    uint32_t numberRefSeqs = BamTools::UnpackUnsignedInt(buffer);
    if (m_isBigEndian) BamTools::SwapEndian_32(numberRefSeqs);
    m_references.reserve((int)numberRefSeqs);

    // iterate over all references in header
    for (unsigned int i = 0; i != numberRefSeqs; ++i) {

        // get length of reference name
        m_stream.Read(buffer, sizeof(uint32_t));
        uint32_t refNameLength = BamTools::UnpackUnsignedInt(buffer);
        if (m_isBigEndian) BamTools::SwapEndian_32(refNameLength);
        RaiiBuffer refName(refNameLength);

        // get reference name and reference sequence length
        m_stream.Read(refName.Buffer, refNameLength);
        m_stream.Read(buffer, sizeof(int32_t));
        int32_t refLength = BamTools::UnpackSignedInt(buffer);
        if (m_isBigEndian) BamTools::SwapEndian_32(refLength);

        // store data for reference
        RefData aReference;
        aReference.RefName = static_cast<std::string>((const char*)refName.Buffer);
        aReference.RefLength = refLength;
        m_references.push_back(aReference);
    }

    // return success
    return true;
}